

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O0

void test_z5_standart_field_constructors<Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined4 local_394;
  basic_cstring<const_char> local_390;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_380;
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  undefined4 local_334;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_320;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  Shared_Zp_field_element<unsigned_int,_void> local_2d4;
  Shared_Zp_field_element<unsigned_int,_void> local_2d0;
  Shared_Zp_field_element<unsigned_int,_void> z5_s2;
  Shared_Zp_field_element<unsigned_int,_void> z5_s1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2b8;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  undefined4 local_26c;
  basic_cstring<const_char> local_268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_258;
  basic_cstring<const_char> local_230;
  basic_cstring<const_char> local_220;
  Shared_Zp_field_element<unsigned_int,_void> local_20c;
  Shared_Zp_field_element<unsigned_int,_void> local_208;
  Shared_Zp_field_element<unsigned_int,_void> z5_m2;
  Shared_Zp_field_element<unsigned_int,_void> z5_m1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1f0;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  Shared_Zp_field_element<unsigned_int,_void> local_1a8;
  undefined4 local_1a4;
  Shared_Zp_field_element<unsigned_int,_void> z5_c3;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_190;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  Shared_Zp_field_element<unsigned_int,_void> local_144;
  Shared_Zp_field_element<unsigned_int,_void> local_140;
  Shared_Zp_field_element<unsigned_int,_void> z5_c2;
  Shared_Zp_field_element<unsigned_int,_void> z5_c1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_128;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  int local_e0 [2];
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  Shared_Zp_field_element<unsigned_int,void> local_7c [4];
  undefined4 local_78;
  Shared_Zp_field_element<unsigned_int,_void> z5_v;
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  Shared_Zp_field_element<unsigned_int,_void> local_c [2];
  Shared_Zp_field_element<unsigned_int,_void> z5_d;
  
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::Shared_Zp_field_element
            (local_c);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x45,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_78 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_58,&local_68,0x45,1,2,local_c,"z5_d",&local_78,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::
  Shared_Zp_field_element<int,void>(local_7c,7);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0x49,&local_a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_e0[1] = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_c8,&local_d8,0x49,1,2,local_7c,"z5_v",local_e0 + 1,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_e0[0] = 7;
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::operator=
            ((Shared_Zp_field_element<unsigned_int,void> *)local_c,local_e0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f0,0x4b,&local_100);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&z5_c1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    z5_c2.element_ = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_128,&z5_c1,0x4b,1,2,local_c,"z5_d",&z5_c2,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::
  Shared_Zp_field_element<int,void>((Shared_Zp_field_element<unsigned_int,void> *)&local_140,7);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::Shared_Zp_field_element
            (&local_144,&local_140);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x50,&local_168);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_190,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&z5_c3,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_1a4 = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_190,&z5_c3,0x50,1,2,&local_144,"z5_c2",&local_1a4,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_190);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::Shared_Zp_field_element
            (&local_1a8,&local_144);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b8,0x52,&local_1c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1f0,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&z5_m1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    z5_m2.element_ = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_1f0,&z5_m1,0x52,1,2,&local_1a8,"z5_c3",&z5_m2,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::
  Shared_Zp_field_element<int,void>((Shared_Zp_field_element<unsigned_int,void> *)&local_208,7);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::Shared_Zp_field_element
            (&local_20c,&local_208);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_230);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_220,0x57,&local_230);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_258,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_26c = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_258,&local_268,0x57,1,2,&local_20c,"z5_m2",&local_26c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_258);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_290);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_280,0x58,&local_290);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2b8,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&z5_s1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    z5_s2.element_ = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_2b8,&z5_s1,0x58,1,2,&local_208,"z5_m1",&z5_s2,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::
  Shared_Zp_field_element<int,void>((Shared_Zp_field_element<unsigned_int,void> *)&local_2d0,4);
  Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::
  Shared_Zp_field_element<int,void>((Shared_Zp_field_element<unsigned_int,void> *)&local_2d4,8);
  Gudhi::persistence_fields::swap(&local_2d0,&local_2d4);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2e8,0x5e,&local_2f8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_320,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_334 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_320,&local_330,0x5e,1,2,&local_2d4,"z5_s2",&local_334,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_320);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_358);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_348,0x5f,&local_358);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_380,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_394 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
              (&local_380,&local_390,0x5f,1,2,&local_2d0,"z5_s1",&local_394,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_380);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void test_z5_standart_field_constructors() {
  // default constructor
  Z5 z5_d;
  BOOST_CHECK_EQUAL(z5_d, 0);

  // value constructor
  Z5 z5_v(7);
  BOOST_CHECK_EQUAL(z5_v, 2);
  z5_d = 7;
  BOOST_CHECK_EQUAL(z5_d, 2);

  // copy constructor
  Z5 z5_c1(7);
  Z5 z5_c2 = z5_c1;
  BOOST_CHECK_EQUAL(z5_c2, 2);
  Z5 z5_c3(z5_c2);
  BOOST_CHECK_EQUAL(z5_c3, 2);

  // move constructor
  Z5 z5_m1(7);
  Z5 z5_m2(std::move(z5_m1));
  BOOST_CHECK_EQUAL(z5_m2, 2);
  BOOST_CHECK_EQUAL(z5_m1, 0);

  // swap
  Z5 z5_s1(4);
  Z5 z5_s2(8);
  swap(z5_s1, z5_s2);
  BOOST_CHECK_EQUAL(z5_s2, 4);
  BOOST_CHECK_EQUAL(z5_s1, 3);
}